

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

iterator __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>::
insert<std::reverse_iterator<pbrt::ParsedParameter*const*>>
          (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           *this,const_iterator pos,reverse_iterator<pbrt::ParsedParameter_*const_*> *first,
          reverse_iterator<pbrt::ParsedParameter_*const_*> *last)

{
  bool bVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIVar2;
  reference args;
  long lVar3;
  reverse_iterator<pbrt::ParsedParameter_*const_*> *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  reverse_iterator<pbrt::ParsedParameter_*const_*> iter;
  iterator startPos;
  iterator pos_1;
  reverse_iterator<pbrt::ParsedParameter_*const_*> *in_stack_ffffffffffffff98;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffa0;
  reverse_iterator<pbrt::ParsedParameter_*const_*> local_38;
  iterator local_30;
  reverse_iterator<pbrt::ParsedParameter_*const_*> *local_28;
  
  pIVar2 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            *)InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              ::end(in_stack_ffffffffffffffa0);
  if (in_RSI == pIVar2) {
    pIVar2 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                ::size(in_RDI);
    std::operator-((reverse_iterator<pbrt::ParsedParameter_*const_*> *)pIVar2,
                   in_stack_ffffffffffffff98);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::reserve(in_RSI,(size_t)in_RDI);
    local_28 = (reverse_iterator<pbrt::ParsedParameter_*const_*> *)
               InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               ::end(pIVar2);
    local_30 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               ::end(pIVar2);
    std::reverse_iterator<pbrt::ParsedParameter_*const_*>::reverse_iterator(&local_38,in_RDX);
    while( true ) {
      bVar1 = std::operator!=((reverse_iterator<pbrt::ParsedParameter_*const_*> *)pIVar2,
                              in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffff98 = local_28;
      args = std::reverse_iterator<pbrt::ParsedParameter_*const_*>::operator*(&local_38);
      pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
      construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*const&>
                ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,
                 (ParsedParameter **)in_stack_ffffffffffffff98,args);
      std::reverse_iterator<pbrt::ParsedParameter_*const_*>::operator++(&local_38);
      local_28 = local_28 + 1;
    }
    lVar3 = std::operator-((reverse_iterator<pbrt::ParsedParameter_*const_*> *)pIVar2,
                           in_stack_ffffffffffffff98);
    in_RDI->nStored = lVar3 + in_RDI->nStored;
    return (iterator)local_28;
  }
  LogFatal(first._4_4_,(char *)last,pos_1._4_4_,(char *)startPos);
}

Assistant:

iterator insert(const_iterator pos, InputIt first, InputIt last) {
        if (pos == end()) {
            reserve(size() + (last - first));
            iterator pos = end(), startPos = end();
            for (auto iter = first; iter != last; ++iter, ++pos)
                alloc.template construct<T>(pos, *iter);
            nStored += last - first;
            return pos;
        } else {
            // TODO
            LOG_FATAL("TODO");
        }
    }